

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_long>
 math::wide_integer::detail::gcd_unsafe<unsigned_long>(unsigned_long u,unsigned_long v)

{
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_int>
  eVar1;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_int>
  local_2c;
  uint local_28;
  enable_if_t<((std::is_integral<unsigned_long>::value)_&&_(std::is_unsigned<unsigned_long>::value)),_unsigned_int>
  local_24;
  uint shift_amount;
  uint trz;
  unsigned_long v_local;
  unsigned_long u_local;
  
  u_local = v;
  if ((u != 0) && (u_local = u, v != 0)) {
    _shift_amount = v;
    v_local = u;
    local_24 = ctz_unsafe<unsigned_long>(u);
    local_2c = ctz_unsafe<unsigned_long>(_shift_amount);
    local_28 = min_unsafe<unsigned_int>(&local_24,&local_2c);
    _shift_amount = _shift_amount >> ((byte)local_28 & 0x3f);
    v_local = v_local >> ((byte)local_24 & 0x3f);
    do {
      eVar1 = ctz_unsafe<unsigned_long>(_shift_amount);
      _shift_amount = _shift_amount >> ((byte)eVar1 & 0x3f);
      if (_shift_amount < v_local) {
        swap_unsafe<unsigned_long>(&v_local,(unsigned_long *)&shift_amount);
      }
      _shift_amount = _shift_amount - v_local;
    } while (_shift_amount != 0);
    u_local = v_local << ((byte)local_28 & 0x3f);
  }
  return u_local;
}

Assistant:

constexpr auto gcd_unsafe(UnsignedIntegralType u, UnsignedIntegralType v) -> std::enable_if_t<(   (std::is_integral<UnsignedIntegralType>::value) // NOLINT(altera-id-dependent-backward-branch)
                                                                                                 && (std::is_unsigned<UnsignedIntegralType>::value)), UnsignedIntegralType>
  {
    using local_unsigned_integral_type = UnsignedIntegralType;

    // Handle cases having (u != 0) and (v != 0).
    if(u == static_cast<local_unsigned_integral_type>(UINT8_C(0))) { return v; }

    if(v == static_cast<local_unsigned_integral_type>(UINT8_C(0))) { return u; }

    // Shift the greatest power of 2 dividing both u and v.
    const unsigned trz { static_cast<unsigned>(ctz_unsafe(u)) };

    const unsigned shift_amount { detail::min_unsafe(trz, ctz_unsafe(v)) };

    v >>= shift_amount;
    u >>= trz;

    do
    {
      // Reduce the GCD.

      v >>= ctz_unsafe(v);

      if(u > v)
      {
        swap_unsafe(u, v);
      }

      v -= u;
    }
    while(v != static_cast<local_unsigned_integral_type>(UINT8_C(0))); // NOLINT(altera-id-dependent-backward-branch)

    return static_cast<local_unsigned_integral_type>(u << shift_amount);
  }